

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O2

bool __thiscall trun::TestRunner::ExecuteModuleTests(TestRunner *this)

{
  undefined1 uVar1;
  TestModuleExecutorBase *pTVar2;
  
  threadContext.currentTestRunner = this;
  (*this->pLogger->_vptr_ILogger[6])(this->pLogger,"Executing library tests");
  pTVar2 = TestModuleExecutorFactory::Create();
  uVar1 = (**(code **)(*(long *)pTVar2 + 0x10))(pTVar2,&this->library,&this->testModules);
  (*this->pLogger->_vptr_ILogger[6])(this->pLogger,"Done: library tests\n\n");
  return (bool)uVar1;
}

Assistant:

bool TestRunner::ExecuteModuleTests() {
    SetCurrentTestRunner(this);
    pLogger->Info("Executing library tests");
    auto &executor = TestModuleExecutorFactory::Create();
    auto res = executor.Execute(library, testModules);
    pLogger->Info("Done: library tests\n\n");
    return res;
}